

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::anon_unknown_26::Register(ExtensionInfo *info)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  int iVar7;
  __node_ptr p_Var8;
  _Hash_node_base *p_Var9;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var10;
  LogMessage *pLVar11;
  unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *puVar12;
  ulong uVar13;
  size_type __n;
  ulong uVar14;
  __node_base _Var15;
  _Hash_node_base *p_Var16;
  pointer __ptr_1;
  undefined1 auVar17 [16];
  __buckets_alloc_type __alloc;
  LogFinisher local_99;
  size_t local_98;
  __node_ptr local_90;
  string local_88;
  LogMessage local_68;
  
  if (((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
       local_static_registry == '\0') &&
     (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   Register(google::protobuf::internal::ExtensionInfo_const&)::
                                   local_static_registry), iVar7 != 0)) {
    puVar12 = (unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               *)operator_new(0x38);
    (puVar12->_M_h)._M_buckets = &(puVar12->_M_h)._M_single_bucket;
    (puVar12->_M_h)._M_bucket_count = 1;
    (puVar12->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (puVar12->_M_h)._M_element_count = 0;
    (puVar12->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (puVar12->_M_h)._M_rehash_policy._M_next_resize = 0;
    (puVar12->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    OnShutdownRun(OnShutdownDelete<std::unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>_>
                  ::anon_class_1_0_00000001::__invoke,puVar12);
    Register::local_static_registry = puVar12;
    __cxa_guard_release(&(anonymous_namespace)::
                         Register(google::protobuf::internal::ExtensionInfo_const&)::
                         local_static_registry);
  }
  puVar12 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  p_Var16 = (_Hash_node_base *)((long)info->number ^ (ulong)info->message);
  uVar13 = (ulong)p_Var16 % (Register::local_static_registry->_M_h)._M_bucket_count;
  p_Var8 = std::
           _Hashtable<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::ExtensionInfo,_std::allocator<google::protobuf::internal::ExtensionInfo>,_std::__detail::_Identity,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_node(&Register::local_static_registry->_M_h,uVar13,info,(__hash_code)p_Var16);
  if (p_Var8 == (__node_ptr)0x0) {
    local_90 = p_Var8;
    p_Var9 = (_Hash_node_base *)operator_new(0x38);
    p_Var9->_M_nxt = (_Hash_node_base *)0x0;
    p_Var3 = *(_Hash_node_base **)&info->number;
    p_Var5 = (_Hash_node_base *)(info->field_5).enum_validity_check.func;
    p_Var6 = (_Hash_node_base *)(info->field_5).enum_validity_check.arg;
    p_Var9[1]._M_nxt = (_Hash_node_base *)info->message;
    p_Var9[2]._M_nxt = p_Var3;
    p_Var9[3]._M_nxt = p_Var5;
    p_Var9[4]._M_nxt = p_Var6;
    p_Var9[5]._M_nxt = (_Hash_node_base *)info->descriptor;
    local_98 = (puVar12->_M_h)._M_rehash_policy._M_next_resize;
    auVar17 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(puVar12->_M_h)._M_rehash_policy,(puVar12->_M_h)._M_bucket_count,
                         (puVar12->_M_h)._M_element_count);
    __n = auVar17._8_8_;
    if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(puVar12->_M_h)._M_single_bucket;
        (puVar12->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_68,__n,
                         (void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var15._M_nxt = (puVar12->_M_h)._M_before_begin._M_nxt;
      (puVar12->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var15._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(puVar12->_M_h)._M_before_begin;
        uVar13 = 0;
        do {
          p_Var3 = (_Var15._M_nxt)->_M_nxt;
          uVar14 = (ulong)_Var15._M_nxt[6]._M_nxt % __n;
          if (__s[uVar14] == (__node_base_ptr)0x0) {
            (_Var15._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var15._M_nxt;
            __s[uVar14] = p_Var1;
            if ((_Var15._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var10 = __s + uVar13;
              goto LAB_003a29eb;
            }
          }
          else {
            (_Var15._M_nxt)->_M_nxt = __s[uVar14]->_M_nxt;
            pp_Var10 = &__s[uVar14]->_M_nxt;
            uVar14 = uVar13;
LAB_003a29eb:
            *pp_Var10 = _Var15._M_nxt;
          }
          _Var15._M_nxt = p_Var3;
          uVar13 = uVar14;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (puVar12->_M_h)._M_buckets;
      if (&(puVar12->_M_h)._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4);
      }
      (puVar12->_M_h)._M_bucket_count = __n;
      (puVar12->_M_h)._M_buckets = __s;
      uVar13 = (ulong)p_Var16 % __n;
    }
    p_Var9[6]._M_nxt = p_Var16;
    pp_Var4 = (puVar12->_M_h)._M_buckets;
    if (pp_Var4[uVar13] == (__node_base_ptr)0x0) {
      p_Var16 = (puVar12->_M_h)._M_before_begin._M_nxt;
      p_Var9->_M_nxt = p_Var16;
      (puVar12->_M_h)._M_before_begin._M_nxt = p_Var9;
      if (p_Var16 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var16[6]._M_nxt % (puVar12->_M_h)._M_bucket_count] = p_Var9;
      }
      (puVar12->_M_h)._M_buckets[uVar13] = &(puVar12->_M_h)._M_before_begin;
    }
    else {
      p_Var9->_M_nxt = pp_Var4[uVar13]->_M_nxt;
      pp_Var4[uVar13]->_M_nxt = p_Var9;
    }
    psVar2 = &(puVar12->_M_h)._M_element_count;
    *psVar2 = *psVar2 + 1;
    if (local_90 == (__node_ptr)0x0) {
      return;
    }
  }
  LogMessage::LogMessage
            (&local_68,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
             ,0x75);
  pLVar11 = LogMessage::operator<<(&local_68,"Multiple extension registrations for type \"");
  (*info->message->_vptr_MessageLite[2])(&local_88);
  pLVar11 = LogMessage::operator<<(pLVar11,&local_88);
  pLVar11 = LogMessage::operator<<(pLVar11,"\", field number ");
  pLVar11 = LogMessage::operator<<(pLVar11,info->number);
  pLVar11 = LogMessage::operator<<(pLVar11,".");
  LogFinisher::operator=(&local_99,pLVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  LogMessage::~LogMessage(&local_68);
  return;
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!InsertIfNotPresent(local_static_registry, info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << info.message->GetTypeName() << "\", field number "
               << info.number << ".";
  }
}